

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O0

void __thiscall arm::Operand2::display(Operand2 *this,ostream *o)

{
  add_pointer_t<const_arm::RegisterOperand> ptVar1;
  add_pointer_t<const_int> ptVar2;
  ostream *this_00;
  ostream *in_RSI;
  add_pointer_t<const_int> x_1;
  add_pointer_t<const_arm::RegisterOperand> x;
  
  ptVar1 = std::get_if<arm::RegisterOperand,arm::RegisterOperand,int>
                     ((variant<arm::RegisterOperand,_int> *)0x2c52d0);
  if (ptVar1 == (add_pointer_t<const_arm::RegisterOperand>)0x0) {
    ptVar2 = std::get_if<int,arm::RegisterOperand,int>
                       ((variant<arm::RegisterOperand,_int> *)0x2c52fb);
    if (ptVar2 != (add_pointer_t<const_int>)0x0) {
      this_00 = std::operator<<(in_RSI,"#");
      std::ostream::operator<<(this_00,*ptVar2);
    }
  }
  else {
    (**(ptVar1->super_Displayable)._vptr_Displayable)(ptVar1,in_RSI);
  }
  return;
}

Assistant:

void Operand2::display(std::ostream &o) const {
  if (auto x = std::get_if<RegisterOperand>(this)) {
    x->display(o);
  } else if (auto x = std::get_if<int32_t>(this)) {
    o << "#" << *x;
  }
}